

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveTrailingPathSeparator
          (FilePath *__return_storage_ptr__,FilePath *this)

{
  pointer pcVar1;
  size_type sVar2;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  pcVar1 = (this->pathname_)._M_dataplus._M_p;
  sVar2 = (this->pathname_)._M_string_length;
  if ((sVar2 == 0) || (pcVar1[sVar2 - 1] != '/')) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + sVar2);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_30,(ulong)this);
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_30,local_28 + (long)local_30);
    Normalize(__return_storage_ptr__);
    if (local_30 != local_20) {
      operator_delete(local_30,local_20[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveTrailingPathSeparator() const {
  return IsDirectory() ? FilePath(pathname_.substr(0, pathname_.length() - 1))
                       : *this;
}